

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_clear_bindings(sqlite3_stmt *pStmt)

{
  sqlite3_mutex *psVar1;
  short sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  psVar1 = *(sqlite3_mutex **)(*(long *)pStmt + 0x18);
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar1);
  }
  sVar2 = *(short *)(pStmt + 0x20);
  if (0 < sVar2) {
    lVar3 = *(long *)(pStmt + 0x80);
    lVar5 = 0;
    lVar4 = 0;
    do {
      if (((*(byte *)(lVar3 + 0x15 + lVar5) & 0x90) != 0) || (*(int *)(lVar3 + 0x20 + lVar5) != 0))
      {
        vdbeMemClear((Mem *)(lVar3 + lVar5));
        lVar3 = *(long *)(pStmt + 0x80);
        sVar2 = *(short *)(pStmt + 0x20);
      }
      *(undefined2 *)(lVar3 + 0x14 + lVar5) = 1;
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x38;
    } while (lVar4 < sVar2);
  }
  if (*(int *)(pStmt + 0x11c) != 0) {
    pStmt[0xc6] = (sqlite3_stmt)(((byte)pStmt[0xc6] & 0xfc) + 1);
  }
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar1);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_clear_bindings(sqlite3_stmt *pStmt){
  int i;
  int rc = SQLITE_OK;
  Vdbe *p = (Vdbe*)pStmt;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = ((Vdbe*)pStmt)->db->mutex;
#endif
  sqlite3_mutex_enter(mutex);
  for(i=0; i<p->nVar; i++){
    sqlite3VdbeMemRelease(&p->aVar[i]);
    p->aVar[i].flags = MEM_Null;
  }
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask ){
    p->expired = 1;
  }
  sqlite3_mutex_leave(mutex);
  return rc;
}